

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O0

void __thiscall
flatbuffers::tests::proto_test_include_id
          (tests *this,string *proto_path,string *proto_file,string *import_proto_file)

{
  bool expval;
  flatbuffers *this_00;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  string golden_file;
  IDLOptions opts;
  string *import_proto_file_local;
  string *proto_file_local;
  string *proto_path_local;
  
  IDLOptions::IDLOptions((IDLOptions *)((long)&golden_file.field_2 + 8));
  std::__cxx11::string::string((string *)local_350);
  std::operator+(&local_370,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 "test_include_id.golden.fbs");
  this_00 = (flatbuffers *)std::__cxx11::string::c_str();
  expval = LoadFile(this_00,(char *)0x0,SUB81(local_350,0),import_proto_file);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile((proto_path + \"test_include_id.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0xb6,"");
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_3a0,(string *)proto_file);
  RunTest((IDLOptions *)((long)&golden_file.field_2 + 8),(string *)this,proto_path,
          (string *)local_350,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)local_350);
  IDLOptions::~IDLOptions((IDLOptions *)((long)&golden_file.field_2 + 8));
  return;
}

Assistant:

void proto_test_include_id(const std::string &proto_path,
                           const std::string &proto_file,
                           const std::string &import_proto_file) {
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = true;
  opts.proto_mode = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  std::string golden_file;
  TEST_EQ(
      flatbuffers::LoadFile((proto_path + "test_include_id.golden.fbs").c_str(),
                            false, &golden_file),
      true);

  RunTest(opts, proto_path, proto_file, golden_file, import_proto_file);
}